

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O0

char * __thiscall kwssys::RegExpCompile::regpiece(RegExpCompile *this,int *flagp)

{
  char cVar1;
  char *val;
  uint uVar2;
  uint *in_RSI;
  RegExpCompile *in_RDI;
  int flags;
  char *next;
  char op;
  char *ret;
  char *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  char *pcVar3;
  char *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  int *in_stack_ffffffffffffffb0;
  RegExpCompile *in_stack_ffffffffffffffb8;
  uint local_34;
  char *local_8;
  
  local_8 = regatom(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if (local_8 == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    cVar1 = *in_RDI->regparse;
    if (((cVar1 == '*') || (cVar1 == '+')) || (cVar1 == '?')) {
      if (((local_34 & 1) == 0) && (cVar1 != '?')) {
        printf("RegularExpression::compile() : *+ operand could be empty.\n");
        local_8 = (char *)0x0;
      }
      else {
        uVar2 = 1;
        if (cVar1 != '+') {
          uVar2 = 4;
        }
        *in_RSI = uVar2;
        if ((cVar1 == '*') && ((local_34 & 2) != 0)) {
          reginsert(in_RDI,'\n',local_8);
        }
        else if (cVar1 == '*') {
          reginsert(in_RDI,'\x06',local_8);
          regnode(in_RDI,'\a');
          regoptail(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
          regoptail(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
          regnode(in_RDI,'\x06');
          regtail(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
          regnode(in_RDI,'\t');
          regtail(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        }
        else if ((cVar1 == '+') && ((local_34 & 2) != 0)) {
          reginsert(in_RDI,'\v',local_8);
        }
        else if (cVar1 == '+') {
          val = regnode(in_RDI,'\x06');
          regtail(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
          regnode(in_RDI,'\a');
          regtail(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
          regnode(in_RDI,'\x06');
          regtail(in_stack_ffffffffffffffa0,val);
          pcVar3 = local_8;
          regnode(in_RDI,'\t');
          regtail(pcVar3,val);
        }
        else if (cVar1 == '?') {
          reginsert(in_RDI,'\x06',local_8);
          pcVar3 = local_8;
          regnode(in_RDI,'\x06');
          regtail(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
          regnode(in_RDI,'\t');
          regtail(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
          regoptail(pcVar3,in_stack_ffffffffffffff88);
        }
        in_RDI->regparse = in_RDI->regparse + 1;
        if (((*in_RDI->regparse == '*') || (*in_RDI->regparse == '+')) || (*in_RDI->regparse == '?')
           ) {
          printf("RegularExpression::compile(): Nested *?+.\n");
          local_8 = (char *)0x0;
        }
      }
    }
    else {
      *in_RSI = local_34;
    }
  }
  return local_8;
}

Assistant:

char* RegExpCompile::regpiece(int* flagp)
{
  char* ret;
  char op;
  char* next;
  int flags;

  ret = regatom(&flags);
  if (ret == nullptr)
    return (nullptr);

  op = *regparse;
  if (!ISMULT(op)) {
    *flagp = flags;
    return (ret);
  }

  if (!(flags & HASWIDTH) && op != '?') {
    // RAISE Error, SYM(RegularExpression), SYM(Empty_Operand),
    printf("RegularExpression::compile() : *+ operand could be empty.\n");
    return nullptr;
  }
  *flagp = (op != '+') ? (WORST | SPSTART) : (WORST | HASWIDTH);

  if (op == '*' && (flags & SIMPLE))
    reginsert(STAR, ret);
  else if (op == '*') {
    // Emit x* as (x&|), where & means "self".
    reginsert(BRANCH, ret);         // Either x
    regoptail(ret, regnode(BACK));  // and loop
    regoptail(ret, ret);            // back
    regtail(ret, regnode(BRANCH));  // or
    regtail(ret, regnode(NOTHING)); // null.
  } else if (op == '+' && (flags & SIMPLE))
    reginsert(PLUS, ret);
  else if (op == '+') {
    // Emit x+ as x(&|), where & means "self".
    next = regnode(BRANCH); // Either
    regtail(ret, next);
    regtail(regnode(BACK), ret);    // loop back
    regtail(next, regnode(BRANCH)); // or
    regtail(ret, regnode(NOTHING)); // null.
  } else if (op == '?') {
    // Emit x? as (x|)
    reginsert(BRANCH, ret);        // Either x
    regtail(ret, regnode(BRANCH)); // or
    next = regnode(NOTHING);       // null.
    regtail(ret, next);
    regoptail(ret, next);
  }
  regparse++;
  if (ISMULT(*regparse)) {
    // RAISE Error, SYM(RegularExpression), SYM(Nested_Operand),
    printf("RegularExpression::compile(): Nested *?+.\n");
    return nullptr;
  }
  return (ret);
}